

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasisFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,char *filename,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  VarStatus VVar1;
  VarStatus *pVVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  undefined7 in_register_00000081;
  long lVar9;
  NameSet *pNVar10;
  ofstream file;
  undefined1 auStack_268 [8];
  NameSet *local_260;
  int local_254;
  int local_250;
  undefined4 local_24c;
  NameSet *local_248;
  long local_240;
  long local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  byte abStack_218 [8];
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  if (this->_isRealLPLoaded == true) {
    bVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::writeBasisFile(&this->_solver,filename,rowNames,colNames,cpxFormat);
    return bVar3;
  }
  local_24c = (undefined4)CONCAT71(in_register_00000081,cpxFormat);
  local_260 = rowNames;
  std::ofstream::ofstream(&local_230,filename,_S_out);
  iVar6 = *(int *)((long)aiStack_210 + *(long *)(local_230 + -0x18));
  if (iVar6 == 0) {
    abStack_218[*(long *)(local_230 + -0x18)] = abStack_218[*(long *)(local_230 + -0x18)] | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NAME  ",6);
    if (filename == (char *)0x0) {
      std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
    }
    else {
      sVar4 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,filename,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    if (this->_hasBasis == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA\n",7);
    }
    else {
      local_238 = (long)(this->_basisStatusCols).thesize;
      local_250 = iVar6;
      if (0 < local_238) {
        local_254 = (this->_basisStatusRows).thesize;
        local_240 = (long)local_254;
        lVar9 = 0;
        iVar6 = 0;
        pNVar10 = local_260;
        local_248 = colNames;
        do {
          VVar1 = (this->_basisStatusCols).data[lVar9];
          if (VVar1 == ON_UPPER) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," UL ",4);
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
            if ((colNames == (NameSet *)0x0) || ((colNames->set).thenum <= lVar9)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"x",1);
              std::ostream::operator<<((ostream *)&local_230,(int)lVar9);
            }
            else if (colNames->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              pNVar10 = local_260;
            }
            else {
              pcVar8 = colNames->mem +
                       (colNames->set).theitem[(colNames->set).thekey[lVar9].idx].data;
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar4)
              ;
              pNVar10 = local_260;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
          }
          else if (VVar1 == BASIC) {
            pVVar2 = (this->_basisStatusRows).data;
            iVar7 = iVar6;
            if (iVar6 < local_254) {
              lVar5 = 0;
              do {
                if (pVVar2[iVar6 + lVar5] != BASIC) {
                  iVar7 = iVar6 + (int)lVar5;
                  break;
                }
                lVar5 = lVar5 + 1;
                iVar7 = local_254;
              } while (local_240 - iVar6 != lVar5);
            }
            pcVar8 = " XL ";
            if ((pVVar2[iVar7] == ON_UPPER) &&
               (((char)local_24c == '\0' ||
                (pcVar8 = " XL ", (this->_rowTypes).data[iVar7] == RANGETYPE_BOXED)))) {
              pcVar8 = " XU ";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,4);
            *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 8;
            if ((colNames == (NameSet *)0x0) || ((colNames->set).thenum <= lVar9)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"x",1);
              std::ostream::operator<<((ostream *)&local_230,(int)lVar9);
            }
            else if (colNames->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              pNVar10 = local_260;
            }
            else {
              pcVar8 = colNames->mem +
                       (colNames->set).theitem[(colNames->set).thekey[lVar9].idx].data;
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar4)
              ;
              pNVar10 = local_260;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"       ",7);
            if (((pNVar10 == (NameSet *)0x0) || (iVar7 < 0)) || ((pNVar10->set).thenum <= iVar7)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"C",1);
              std::ostream::operator<<((ostream *)&local_230,iVar7);
            }
            else if (pNVar10->mem == (char *)0x0) {
              std::ios::clear((int)auStack_268 + (int)*(undefined8 *)(local_230 + -0x18) + 0x38);
              colNames = local_248;
            }
            else {
              pcVar8 = pNVar10->mem + (pNVar10->set).theitem[(pNVar10->set).thekey[iVar7].idx].data;
              sVar4 = strlen(pcVar8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar4)
              ;
              colNames = local_248;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
            iVar6 = iVar7 + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != local_238);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"ENDATA\n",7);
      iVar6 = local_250;
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar6 == 0;
}

Assistant:

bool SoPlexBase<R>::writeBasisFile(const char* filename, const NameSet* rowNames,
                                   const NameSet* colNames, const bool cpxFormat) const
{
   assert(filename != nullptr);

   if(_isRealLPLoaded)
      return _solver.writeBasisFile(filename, rowNames, colNames, cpxFormat);
   else
   {
      std::ofstream file(filename);

      if(!file.good())
         return false;

      file.setf(std::ios::left);
      file << "NAME  " << filename << "\n";

      // do not write basis if there is none
      if(!_hasBasis)
      {
         file << "ENDATA\n";
         return true;
      }

      // start writing
      int numRows = _basisStatusRows.size();
      int numCols = _basisStatusCols.size();
      int row = 0;

      for(int col = 0; col < numCols; col++)
      {
         assert(_basisStatusCols[col] != SPxSolverBase<R>::UNDEFINED);

         if(_basisStatusCols[col] == SPxSolverBase<R>::BASIC)
         {
            // find nonbasic row
            for(; row < numRows; row++)
            {
               assert(_basisStatusRows[row] != SPxSolverBase<R>::UNDEFINED);

               if(_basisStatusRows[row] != SPxSolverBase<R>::BASIC)
                  break;
            }

            assert(row != numRows);

            if(_basisStatusRows[row] == SPxSolverBase<R>::ON_UPPER && (!cpxFormat
                  || _rowTypes[row] == SoPlexBase<R>::RANGETYPE_BOXED))
               file << " XU ";
            else
               file << " XL ";

            file << std::setw(8);

            if(colNames != nullptr && colNames->has(col))
               file << (*colNames)[col];
            else
               file << "x" << col;

            file << "       ";

            if(rowNames != nullptr && rowNames->has(row))
               file << (*rowNames)[row];
            else
               file << "C" << row;

            file << "\n";
            row++;
         }
         else
         {
            if(_basisStatusCols[col] == SPxSolverBase<R>::ON_UPPER)
            {
               file << " UL ";

               file << std::setw(8);

               if(colNames != nullptr && colNames->has(col))
                  file << (*colNames)[col];
               else
                  file << "x" << col;

               file << "\n";
            }
         }
      }

      file << "ENDATA\n";

#ifndef NDEBUG

      // check that the remaining rows are basic
      for(; row < numRows; row++)
      {
         assert(_basisStatusRows[row] == SPxSolverBase<R>::BASIC);
      }

#endif

      return true;
   }
}